

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall
FBlockLinesIterator::FBlockLinesIterator
          (FBlockLinesIterator *this,int _minx,int _miny,int _maxx,int _maxy,bool keepvalidcount)

{
  undefined3 in_register_00000089;
  
  if (CONCAT31(in_register_00000089,keepvalidcount) == 0) {
    validcount = validcount + 1;
  }
  this->minx = _minx;
  this->maxx = _maxx;
  this->miny = _miny;
  this->maxy = _maxy;
  StartBlock(this,_minx,_miny);
  return;
}

Assistant:

FBlockLinesIterator::FBlockLinesIterator(int _minx, int _miny, int _maxx, int _maxy, bool keepvalidcount)
{
	if (!keepvalidcount) validcount++;
	minx = _minx;
	maxx = _maxx;
	miny = _miny;
	maxy = _maxy;
	Reset();
}